

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompose.hpp
# Opt level: O0

void __thiscall MGARD::Decomposer<float>::Decomposer(Decomposer<float> *this,bool use_sz_)

{
  byte in_SIL;
  undefined4 *in_RDI;
  
  *in_RDI = 0x20;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined1 *)(in_RDI + 4) = 1;
  *(undefined8 *)(in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0xc) = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10d776);
  *(byte *)(in_RDI + 4) = in_SIL & 1;
  return;
}

Assistant:

Decomposer(bool use_sz_=true){
            use_sz = use_sz_;
        }